

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshMapper.h
# Opt level: O2

void anurbs::MeshMapper<3L>::register_python(module *m)

{
  string name;
  class_<anurbs::MeshMapper<3L>_> cStack_88;
  char *local_80 [4];
  arg local_60;
  arg local_50;
  code *local_40;
  undefined8 local_38;
  arg local_30;
  arg local_20;
  
  MeshMapper<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::MeshMapper<3L>_>::class_<>
            (&cStack_88,(m->super_object).super_handle.m_ptr,local_80[0]);
  local_20.name = "vertices";
  local_20._8_1_ = 2;
  local_30.name = "faces";
  local_30._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_&,_Eigen::Ref<const_Eigen::Matrix<long,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_&>
  ::execute<pybind11::class_<anurbs::MeshMapper<3L>_>,_pybind11::arg,_pybind11::arg,_0>
            (&cStack_88,&local_20,&local_30);
  local_40 = map;
  local_38 = 0;
  local_50.name = "point";
  local_50._8_1_ = 2;
  local_60.name = "max_distance";
  local_60._8_1_ = 2;
  pybind11::class_<anurbs::MeshMapper<3l>>::
  def<std::tuple<bool,Eigen::Matrix<double,1,3,1,1,3>,std::pair<long,Eigen::Matrix<double,1,3,1,1,3>>,double>(anurbs::MeshMapper<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>,double),pybind11::arg,pybind11::arg>
            ((class_<anurbs::MeshMapper<3l>> *)&cStack_88,"map",(offset_in_Model_to_subr *)&local_40
             ,&local_50,&local_60);
  pybind11::object::~object((object *)&cStack_88);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            // constructors
            .def(py::init<Eigen::Ref<const Vertices>&, Eigen::Ref<const Faces>&>(), "vertices"_a, "faces"_a)
            // methods
            .def("map", &Type::map, "point"_a, "max_distance"_a);
    }